

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O0

string * __thiscall
pfederc::LambdaExpr::toString_abi_cxx11_(string *__return_storage_ptr__,LambdaExpr *this)

{
  bool bVar1;
  reference this_00;
  pointer pEVar2;
  pointer this_01;
  string local_78;
  string local_58 [32];
  __normal_iterator<const_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>
  local_38;
  __normal_iterator<const_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>
  local_30;
  __normal_iterator<const_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>
  local_28;
  const_iterator it;
  LambdaExpr *this_local;
  string *result;
  
  it._M_current._7_1_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"lambda ",
             (allocator<char> *)((long)&it._M_current + 6));
  std::allocator<char>::~allocator((allocator<char> *)((long)&it._M_current + 6));
  bVar1 = std::
          vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
          ::empty(&this->params);
  if (!bVar1) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'(');
    local_28._M_current =
         (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
         std::
         vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
         ::begin(&this->params);
    while( true ) {
      local_30._M_current =
           (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
           std::
           vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
           ::end(&this->params);
      bVar1 = __gnu_cxx::operator!=(&local_28,&local_30);
      if (!bVar1) break;
      local_38._M_current =
           (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
           std::
           vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
           ::begin(&this->params);
      bVar1 = __gnu_cxx::operator!=(&local_28,&local_38);
      if (bVar1) {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", ");
      }
      this_00 = __gnu_cxx::
                __normal_iterator<const_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>
                ::operator*(&local_28);
      pEVar2 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator->
                         (this_00);
      (*pEVar2->_vptr_Expr[2])();
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_58);
      std::__cxx11::string::~string(local_58);
      __gnu_cxx::
      __normal_iterator<const_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>
      ::operator++(&local_28);
    }
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,')');
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'\n');
  this_01 = std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>::operator->
                      (&this->body);
  BodyExpr::toString_abi_cxx11_(&local_78,this_01);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,';');
  return __return_storage_ptr__;
}

Assistant:

std::string LambdaExpr::toString() const noexcept {
  std::string result = "lambda ";
  if (!params.empty()) {
    result += '(';
    for (auto it = params.begin(); it != params.end(); ++it) {
      if (it != params.begin())
        result += ", ";
      result += (*it)->toString();
    }
    result += ')';
  }

  result += '\n';

  result += body->toString();
  result += ';';
  return result;
}